

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void testing::internal::ReportUninterestingCall(CallReaction reaction,string *msg)

{
  pointer pcVar1;
  int iVar2;
  FailureReporterInterface *pFVar3;
  uint stack_frames_to_skip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_40;
  
  iVar2 = std::__cxx11::string::compare(FLAGS_gmock_verbose_abi_cxx11_);
  stack_frames_to_skip = -(uint)(iVar2 != 0) | 3;
  if (reaction == kWarn) {
    pcVar1 = (msg->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + msg->_M_string_length);
    std::__cxx11::string::append((char *)&local_40);
    Log(kWarning,&local_40,stack_frames_to_skip);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  if (reaction == kAllow) {
    Log(kInfo,msg,stack_frames_to_skip);
    return;
  }
  pFVar3 = GetFailureReporter();
  (*pFVar3->_vptr_FailureReporterInterface[2])
            (pFVar3,0,0,0xffffffff,msg,pFVar3->_vptr_FailureReporterInterface[2]);
  return;
}

Assistant:

void ReportUninterestingCall(CallReaction reaction, const std::string& msg) {
  // Include a stack trace only if --gmock_verbose=info is specified.
  const int stack_frames_to_skip =
      GMOCK_FLAG(verbose) == kInfoVerbosity ? 3 : -1;
  switch (reaction) {
    case kAllow:
      Log(kInfo, msg, stack_frames_to_skip);
      break;
    case kWarn:
      Log(kWarning,
          msg +
              "\nNOTE: You can safely ignore the above warning unless this "
              "call should not happen.  Do not suppress it by blindly adding "
              "an EXPECT_CALL() if you don't mean to enforce the call.  "
              "See "
              "https://github.com/google/googletest/blob/master/googlemock/"
              "docs/cook_book.md#"
              "knowing-when-to-expect for details.\n",
          stack_frames_to_skip);
      break;
    default:  // FAIL
      Expect(false, nullptr, -1, msg);
  }
}